

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

string * tinyformat::format<short>(char *fmt,short *args)

{
  string *in_RDI;
  ostringstream oss;
  ostringstream local_190 [16];
  short *in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe88;
  ostream *in_stack_fffffffffffffe90;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  format<short>(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return in_RDI;
}

Assistant:

std::string format(const char* fmt, const Args&... args)
{
    std::ostringstream oss;
    format(oss, fmt, args...);
    return oss.str();
}